

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_session_event_timer_cb(epoll_event *ev)

{
  short sVar1;
  undefined1 local_20 [8];
  uint64_t res;
  nh_session_t *session;
  epoll_event *ev_local;
  
  res = (ev->data).u64 - 8;
  session = (nh_session_t *)ev;
  read(*(int *)((ev->data).u64 + 0xc),local_20,8);
  sVar1 = *(short *)(res + 0xc2) + -1;
  *(short *)(res + 0xc2) = sVar1;
  if (sVar1 == 0) {
    nh_session_free((nh_session_t *)res);
  }
  return;
}

Assistant:

void nh_session_event_timer_cb(struct epoll_event *ev) {
    // data.ptr = &session->timer_handler
    // data.ptr - sizeof(ev_handler_t) = &session
    nh_session_t *session = (nh_session_t *) (ev->data.ptr - sizeof(ev_handler_t));
    uint64_t res;
    read(session->timer_fd, &res, sizeof(res));
    if (--session->timeout == 0) {
        nh_session_free(session);
    }
}